

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.cc
# Opt level: O1

void BLAKE2B256_Final(uint8_t *out,BLAKE2B_CTX *b2b)

{
  size_t sVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  
  sVar1 = b2b->block_used;
  if (sVar1 != 0x80) {
    memset(b2b->block + sVar1,0,0x80 - sVar1);
  }
  blake2b_transform(b2b,b2b->block,b2b->block_used,1);
  uVar2 = b2b->h[0];
  uVar3 = b2b->h[1];
  uVar4 = b2b->h[3];
  *(uint64_t *)(out + 0x10) = b2b->h[2];
  *(uint64_t *)(out + 0x18) = uVar4;
  *(uint64_t *)out = uVar2;
  *(uint64_t *)(out + 8) = uVar3;
  return;
}

Assistant:

void BLAKE2B256_Final(uint8_t out[BLAKE2B256_DIGEST_LENGTH], BLAKE2B_CTX *b2b) {
  OPENSSL_memset(&b2b->block[b2b->block_used], 0,
                 sizeof(b2b->block) - b2b->block_used);
  blake2b_transform(b2b, b2b->block, b2b->block_used,
                    /*is_final_block=*/1);
  static_assert(BLAKE2B256_DIGEST_LENGTH <= sizeof(b2b->h), "");
  memcpy(out, b2b->h, BLAKE2B256_DIGEST_LENGTH);
}